

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O3

int coda_cursor_goto_attributes(coda_cursor_conflict *cursor)

{
  coda_backend cVar1;
  coda_dynamic_type_struct *pcVar2;
  int iVar3;
  int iVar4;
  
  if (((cursor == (coda_cursor_conflict *)0x0) || (iVar3 = cursor->n, iVar3 < 1)) ||
     (pcVar2 = cursor->stack[iVar3 - 1].type, pcVar2 == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x4d7);
    return -1;
  }
  if (iVar3 == 0x20) {
    coda_set_error(-100,"maximum depth in cursor (%d) reached (%s:%u)",0x20,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x4de);
    return -1;
  }
  cVar1 = pcVar2->backend;
  switch(cVar1) {
  case coda_backend_memory:
    iVar3 = coda_mem_cursor_goto_attributes(cursor);
    break;
  case coda_backend_hdf4:
    iVar3 = -0xb;
    goto LAB_0010f2a7;
  case coda_backend_hdf5:
    iVar3 = -0xd;
LAB_0010f2a7:
    coda_set_error(iVar3,(char *)0x0);
    return -1;
  case coda_backend_cdf:
    iVar3 = coda_cdf_cursor_goto_attributes(cursor);
    break;
  case coda_backend_netcdf:
    iVar3 = coda_netcdf_cursor_goto_attributes(cursor);
    break;
  case coda_backend_grib:
    iVar3 = coda_grib_cursor_goto_attributes(cursor);
    break;
  default:
    if (cVar1 < 2) {
      iVar3 = coda_ascbin_cursor_goto_attributes(cursor);
      break;
    }
    goto LAB_0010f2c3;
  }
  iVar4 = -1;
  if (iVar3 == 0) {
LAB_0010f2c3:
    iVar4 = 0;
    if ((cursor->stack[(long)cursor->n + -1].type)->backend == coda_backend_memory) {
      coda_mem_cursor_update_offset(cursor);
    }
  }
  return iVar4;
}

Assistant:

LIBCODA_API int coda_cursor_goto_attributes(coda_cursor *cursor)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (cursor->n == CODA_CURSOR_MAXDEPTH)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "maximum depth in cursor (%d) reached (%s:%u)", cursor->n, __FILE__,
                       __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            if (coda_ascbin_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_memory:
            if (coda_mem_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            if (coda_hdf4_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            if (coda_hdf5_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            if (coda_cdf_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_netcdf:
            if (coda_netcdf_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_grib:
            if (coda_grib_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
    }

    if (cursor->stack[cursor->n - 1].type->backend == coda_backend_memory)
    {
        coda_mem_cursor_update_offset(cursor);
    }

    return 0;
}